

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O0

void UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  byte bVar1;
  char cVar2;
  UChar *sourceLimit;
  void *pvVar3;
  UConverter *pUVar4;
  bool bVar5;
  int iVar6;
  ushort uVar7;
  UBool UVar8;
  int iVar9;
  UChar *pUVar10;
  uint8_t trailByte;
  int trailIsOk;
  int leadIsOk;
  int32_t tempBufLen;
  StateEnum tempState;
  UConverterSharedData *cnv;
  int8_t toULengthBefore;
  char *mySourceBefore;
  ISO2022State *pToU2022State;
  UConverterDataISO2022 *myData;
  uint32_t mySourceChar;
  uint32_t targetUniChar;
  char *mySourceLimit;
  UChar *myTarget;
  char *mySource;
  UErrorCode *pUStack_18;
  char tempBuf [3];
  UErrorCode *err_local;
  UConverterToUnicodeArgs *args_local;
  
  myTarget = (UChar *)args->source;
  mySourceLimit = (char *)args->target;
  sourceLimit = (UChar *)args->sourceLimit;
  pvVar3 = args->converter->extraInfo;
  pUStack_18 = err;
  if (*(int *)((long)pvVar3 + 0x68) == 0) {
    if (args->converter->toULength != '\x01') goto LAB_004144f4;
    if (sourceLimit <= myTarget) goto LAB_004144f4;
    if (args->targetLimit <= mySourceLimit) goto LAB_004144f4;
    myData._0_4_ = (uint)args->converter->toUBytes[0];
    args->converter->toULength = '\0';
    goto LAB_0041470c;
  }
  do {
    pUVar10 = myTarget;
    cVar2 = args->converter->toULength;
    changeState_2022(args->converter,(char **)&myTarget,(char *)sourceLimit,ISO_2022_CN,pUStack_18);
    if (((*(int *)((long)pvVar3 + 0x68) == 0) && (UVar8 = U_SUCCESS(*pUStack_18), UVar8 != '\0')) &&
       (*(char *)((long)pvVar3 + 0x70) != '\0')) {
      *pUStack_18 = U_ILLEGAL_ESCAPE_SEQUENCE;
      args->converter->toUCallbackReason = UCNV_IRREGULAR;
      args->converter->toULength = cVar2 + ((char)myTarget - (char)pUVar10);
    }
    UVar8 = U_FAILURE(*pUStack_18);
    if (UVar8 != '\0') {
      args->target = (UChar *)mySourceLimit;
      args->source = (char *)myTarget;
      *(undefined1 *)((long)pvVar3 + 0x70) = 0;
      return;
    }
LAB_004144f4:
    if (sourceLimit <= myTarget) goto LAB_00414a95;
    myData._4_4_ = 0xffff;
    if (args->targetLimit <= mySourceLimit) {
      *pUStack_18 = U_BUFFER_OVERFLOW_ERROR;
      goto LAB_00414a95;
    }
    pUVar10 = (UChar *)((long)myTarget + 1);
    bVar1 = (byte)*myTarget;
    myData._0_4_ = (uint)bVar1;
    switch((uint)myData) {
    case 10:
    case 0xd:
      myTarget = pUVar10;
      memset((void *)((long)pvVar3 + 0x5c),0,6);
      pUVar10 = myTarget;
    default:
      myTarget = pUVar10;
      *(undefined1 *)((long)pvVar3 + 0x70) = 0;
      if (*(char *)((long)pvVar3 + 0x60) == '\0') {
        if ((uint)myData < 0x80) {
          myData._4_4_ = (uint)myData;
        }
      }
      else {
        if (sourceLimit <= myTarget) {
          args->converter->toUBytes[0] = bVar1;
          args->converter->toULength = '\x01';
          goto LAB_00414a95;
        }
LAB_0041470c:
        myData._4_4_ = 0xffff;
        bVar1 = (byte)*myTarget;
        bVar5 = 0x5d < (byte)(bVar1 - 0x21);
        if ((0x5d < ((uint)myData - 0x21 & 0xff)) || (bVar5)) {
          if ((bVar5) && ((0x1f < bVar1 || ((1 << (bVar1 & 0x1f) & 0x800c000U) == 0)))) {
            myTarget = (UChar *)((long)myTarget + 1);
            myData._0_4_ = (uint)myData << 8 | 0x10000 | (uint)bVar1;
          }
        }
        else {
          myTarget = (UChar *)((long)myTarget + 1);
          cVar2 = *(char *)((long)pvVar3 + 0x5c + (long)*(char *)((long)pvVar3 + 0x60));
          if (cVar2 < 0x20) {
            _tempBufLen = *(UConverterSharedData **)((long)pvVar3 + (long)(int)cVar2 * 8);
            trailIsOk = 2;
            mySource._5_1_ = (byte)(uint)myData;
            mySource._6_1_ = bVar1;
          }
          else {
            _tempBufLen = *(UConverterSharedData **)((long)pvVar3 + 0x18);
            trailIsOk = 3;
            mySource._5_1_ = cVar2 + 0x60;
            mySource._6_1_ = (byte)(uint)myData;
            mySource._7_1_ = bVar1;
          }
          myData._4_4_ = ucnv_MBCSSimpleGetNextUChar_63
                                   (_tempBufLen,(char *)((long)&mySource + 5),trailIsOk,'\0');
          myData._0_4_ = (uint)myData << 8 | (uint)bVar1;
        }
        if ('\x01' < *(char *)((long)pvVar3 + 0x60)) {
          *(undefined1 *)((long)pvVar3 + 0x60) = *(undefined1 *)((long)pvVar3 + 0x61);
        }
      }
LAB_0041488f:
      iVar6 = (int)myTarget;
      if (myData._4_4_ < 0xfffe) {
        if (args->offsets != (int32_t *)0x0) {
          iVar9 = 2;
          if ((uint)myData < 0x100) {
            iVar9 = 1;
          }
          args->offsets[(long)mySourceLimit - (long)args->target >> 1] =
               (iVar6 - (int)args->source) - iVar9;
        }
        *(short *)mySourceLimit = (short)myData._4_4_;
        mySourceLimit = mySourceLimit + 2;
      }
      else {
        if (myData._4_4_ < 0x10000) {
          toUnicodeCallback(args->converter,(uint)myData,myData._4_4_,pUStack_18);
LAB_00414a95:
          args->target = (UChar *)mySourceLimit;
          args->source = (char *)myTarget;
          return;
        }
        *(short *)mySourceLimit = (short)(myData._4_4_ - 0x10000 >> 10) + -0x2800;
        if (args->offsets != (int32_t *)0x0) {
          iVar9 = 2;
          if ((uint)myData < 0x100) {
            iVar9 = 1;
          }
          args->offsets[(long)mySourceLimit - (long)args->target >> 1] =
               (iVar6 - (int)args->source) - iVar9;
        }
        pUVar10 = (UChar *)(mySourceLimit + 2);
        uVar7 = (ushort)(myData._4_4_ - 0x10000);
        if (pUVar10 < args->targetLimit) {
          *pUVar10 = (uVar7 & 0x3ff) + L'\xdc00';
          if (args->offsets != (int32_t *)0x0) {
            iVar9 = 2;
            if ((uint)myData < 0x100) {
              iVar9 = 1;
            }
            args->offsets[(long)pUVar10 - (long)args->target >> 1] =
                 (iVar6 - (int)args->source) - iVar9;
          }
          mySourceLimit = mySourceLimit + 4;
        }
        else {
          pUVar4 = args->converter;
          cVar2 = args->converter->UCharErrorBufferLength;
          args->converter->UCharErrorBufferLength = cVar2 + '\x01';
          pUVar4->UCharErrorBuffer[cVar2] = (uVar7 & 0x3ff) + L'\xdc00';
          mySourceLimit = (char *)pUVar10;
        }
      }
      goto LAB_004144f4;
    case 0xe:
      if (*(char *)((long)pvVar3 + 0x5d) == '\0') {
        *(undefined1 *)((long)pvVar3 + 0x70) = 0;
        myTarget = pUVar10;
        goto LAB_0041488f;
      }
      *(undefined1 *)((long)pvVar3 + 0x60) = 1;
      *(undefined1 *)((long)pvVar3 + 0x70) = 1;
      myTarget = pUVar10;
      goto LAB_004144f4;
    case 0xf:
      goto switchD_00414556_caseD_f;
    case 0x1b:
    }
  } while( true );
switchD_00414556_caseD_f:
  *(undefined1 *)((long)pvVar3 + 0x60) = 0;
  myTarget = pUVar10;
  if (*(char *)((long)pvVar3 + 0x70) != '\0') {
    *(undefined1 *)((long)pvVar3 + 0x70) = 0;
    *pUStack_18 = U_ILLEGAL_ESCAPE_SEQUENCE;
    args->converter->toUCallbackReason = UCNV_IRREGULAR;
    args->converter->toUBytes[0] = bVar1;
    args->converter->toULength = '\x01';
    args->target = (UChar *)mySourceLimit;
    args->source = (char *)pUVar10;
    return;
  }
  goto LAB_004144f4;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_CN_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                               UErrorCode* err){
    char tempBuf[3];
    const char *mySource = (char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    uint32_t targetUniChar = 0x0000;
    uint32_t mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    ISO2022State *pToU2022State;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    pToU2022State = &myData->toU2022State;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        targetUniChar = missingCharMarker;
        goto getTrailByte;
    }

    while(mySource < mySourceLimit){

        targetUniChar =missingCharMarker;

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            switch(mySourceChar){
            case UCNV_SI:
                pToU2022State->g=0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = static_cast<uint8_t>(mySourceChar);
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;

            case UCNV_SO:
                if(pToU2022State->cs[1] != 0) {
                    pToU2022State->g=1;
                    myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                    continue;
                } else {
                    /* illegal to have SO before a matching designator */
                    myData->isEmptySegment = FALSE;	/* Handling a different error, reset this to avoid future spurious errs */
                    break;
                }

            case ESC_2022:
                mySource--;
escape:
                {
                    const char * mySourceBefore = mySource;
                    int8_t toULengthBefore = args->converter->toULength;

                    changeState_2022(args->converter,&(mySource),
                        mySourceLimit, ISO_2022_CN,err);

                    /* After SO there must be at least one character before a designator (designator error handled separately) */
                    if(myData->key==0 && U_SUCCESS(*err) && myData->isEmptySegment) {
                        *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                        args->converter->toUCallbackReason = UCNV_IRREGULAR;
                        args->converter->toULength = (int8_t)(toULengthBefore + (mySource - mySourceBefore));
                    }
                }

                /* invalid or illegal escape sequence */
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    myData->isEmptySegment = FALSE;	/* Reset to avoid future spurious errors */
                    return;
                }
                continue;

            /* ISO-2022-CN does not use single-byte (C1) SS2 and SS3 */

            case CR:
            case LF:
                uprv_memset(pToU2022State, 0, sizeof(ISO2022State));
                U_FALLTHROUGH;
            default:
                /* convert one or two bytes */
                myData->isEmptySegment = FALSE;
                if(pToU2022State->g != 0) {
                    if(mySource < mySourceLimit) {
                        UConverterSharedData *cnv;
                        StateEnum tempState;
                        int32_t tempBufLen;
                        int leadIsOk, trailIsOk;
                        uint8_t trailByte;
getTrailByte:
                        trailByte = (uint8_t)*mySource;
                        /*
                         * Ticket 5691: consistent illegal sequences:
                         * - We include at least the first byte in the illegal sequence.
                         * - If any of the non-initial bytes could be the start of a character,
                         *   we stop the illegal sequence before the first one of those.
                         *
                         * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                         * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                         * Otherwise we convert or report the pair of bytes.
                         */
                        leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                        trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                        if (leadIsOk && trailIsOk) {
                            ++mySource;
                            tempState = (StateEnum)pToU2022State->cs[pToU2022State->g];
                            if(tempState >= CNS_11643_0) {
                                cnv = myData->myConverterArray[CNS_11643];
                                tempBuf[0] = (char) (0x80+(tempState-CNS_11643_0));
                                tempBuf[1] = (char) (mySourceChar);
                                tempBuf[2] = (char) trailByte;
                                tempBufLen = 3;

                            }else{
                                U_ASSERT(tempState<UCNV_2022_MAX_CONVERTERS);
                                cnv = myData->myConverterArray[tempState];
                                tempBuf[0] = (char) (mySourceChar);
                                tempBuf[1] = (char) trailByte;
                                tempBufLen = 2;
                            }
                            targetUniChar = ucnv_MBCSSimpleGetNextUChar(cnv, tempBuf, tempBufLen, FALSE);
                            mySourceChar = (mySourceChar << 8) | trailByte;
                        } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                            /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                            ++mySource;
                            /* add another bit so that the code below writes 2 bytes in case of error */
                            mySourceChar = 0x10000 | (mySourceChar << 8) | trailByte;
                        }
                        if(pToU2022State->g>=2) {
                            /* return from a single-shift state to the previous one */
                            pToU2022State->g=pToU2022State->prevG;
                        }
                    } else {
                        args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                        args->converter->toULength = 1;
                        goto endloop;
                    }
                }
                else{
                    if(mySourceChar <= 0x7f) {
                        targetUniChar = (UChar) mySourceChar;
                    }
                }
                break;
            }
            if(targetUniChar < (missingCharMarker-1/*0xfffe*/)){
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else if(targetUniChar > missingCharMarker){
                /* disassemble the surrogate pair and write to output*/
                targetUniChar-=0x0010000;
                *myTarget = (UChar)(0xd800+(UChar)(targetUniChar>>10));
                if(args->offsets){
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                ++myTarget;
                if(myTarget< args->targetLimit){
                    *myTarget = (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                    if(args->offsets){
                        args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                    }
                    ++myTarget;
                }else{
                    args->converter->UCharErrorBuffer[args->converter->UCharErrorBufferLength++]=
                                    (UChar)(0xdc00+(UChar)(targetUniChar&0x3ff));
                }

            }
            else{
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
endloop:
    args->target = myTarget;
    args->source = mySource;
}